

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O0

void __thiscall
Function_Pool::AreaInfo::_calculate
          (AreaInfo *this,uint32_t x,uint32_t y,uint32_t width_,uint32_t height_,uint32_t count)

{
  uint32_t maximumYTaskCount;
  uint32_t maximumXTaskCount;
  uint32_t in_stack_00000048;
  uint32_t in_stack_0000004c;
  AreaInfo *in_stack_00000050;
  
  _fill(in_stack_00000050,in_stack_0000004c,in_stack_00000048,this._4_4_,(uint32_t)this,x,y._3_1_);
  return;
}

Assistant:

void AreaInfo::_calculate( uint32_t x, uint32_t y, uint32_t width_, uint32_t height_, uint32_t count )
    {
        uint32_t maximumXTaskCount = width_ / cacheSize;
        if( maximumXTaskCount == 0 )
            maximumXTaskCount = 1;
        if( maximumXTaskCount > count )
            maximumXTaskCount = count;

        uint32_t maximumYTaskCount = height_;
        if( maximumYTaskCount > count )
            maximumYTaskCount = count;

        count = (maximumYTaskCount >= maximumXTaskCount) ? maximumYTaskCount : maximumXTaskCount;

        _fill( x, y, width_, height_, count, maximumYTaskCount >= maximumXTaskCount );
    }